

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

int expansion_sum(int elen,double *e,int flen,double *f,double *h)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  uVar1 = 0;
  uVar3 = (ulong)(uint)elen;
  dVar6 = *f;
  if (elen < 1) {
    uVar3 = uVar1;
  }
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    dVar7 = dVar6 + e[uVar1];
    h[uVar1] = (dVar6 - (dVar7 - (dVar7 - dVar6))) + (e[uVar1] - (dVar7 - dVar6));
    dVar6 = dVar7;
  }
  h[uVar3] = dVar6;
  pdVar2 = h + 1;
  uVar1 = uVar3;
  for (lVar4 = 1; lVar4 < flen; lVar4 = lVar4 + 1) {
    dVar6 = f[lVar4];
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      dVar7 = dVar6 + pdVar2[uVar5];
      pdVar2[uVar5] = (dVar6 - (dVar7 - (dVar7 - dVar6))) + (pdVar2[uVar5] - (dVar7 - dVar6));
      dVar6 = dVar7;
    }
    h[uVar1 + 1] = dVar6;
    uVar1 = uVar1 + 1;
    pdVar2 = pdVar2 + 1;
  }
  return (int)uVar1 + 1;
}

Assistant:

int expansion_sum(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* e and h can be the same, but f and h cannot. */
{
  REAL Q;
  INEXACT REAL Qnew;
  int findex, hindex, hlast;
  REAL hnow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;

  Q = f[0];
  for (hindex = 0; hindex < elen; hindex++) {
    hnow = e[hindex];
    Two_Sum(Q, hnow, Qnew, h[hindex]);
    Q = Qnew;
  }
  h[hindex] = Q;
  hlast = hindex;
  for (findex = 1; findex < flen; findex++) {
    Q = f[findex];
    for (hindex = findex; hindex <= hlast; hindex++) {
      hnow = h[hindex];
      Two_Sum(Q, hnow, Qnew, h[hindex]);
      Q = Qnew;
    }
    h[++hlast] = Q;
  }
  return hlast + 1;
}